

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict.cpp
# Opt level: O0

int __thiscall SAT::findConflictLevel(SAT *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Lit *pLVar4;
  int *piVar5;
  char *pcVar6;
  Clause CVar7;
  Clause *in_RDI;
  int clevel;
  int l;
  uint i;
  int tp;
  int in_stack_ffffffffffffffac;
  Clause *in_stack_ffffffffffffffb0;
  Engine *in_stack_ffffffffffffffb8;
  FILE *__stream;
  SAT *in_stack_ffffffffffffffc0;
  undefined1 learnt;
  uint local_18;
  int local_14;
  
  local_14 = -1;
  local_18 = 0;
  while( true ) {
    uVar2 = local_18;
    uVar1 = Clause::size((Clause *)in_RDI[0x1e]);
    if (uVar1 <= uVar2) break;
    in_stack_ffffffffffffffc0 = (SAT *)(in_RDI + 0xe);
    pLVar4 = Clause::operator[](in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    uVar2 = ::var((Lit)pLVar4->x);
    piVar5 = vec<int>::operator[]((vec<int> *)in_stack_ffffffffffffffc0,uVar2);
    if (local_14 < *piVar5) {
      local_14 = *piVar5;
    }
    local_18 = local_18 + 1;
  }
  uVar1 = Engine::tpToLevel(in_stack_ffffffffffffffb8,
                            (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
  learnt = (undefined1)(uVar2 >> 0x18);
  if (((so.sym_static & 1U) != 0) && (uVar1 == 0)) {
    btToLevel(in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    engine.async_fail = true;
    __stream = _stderr;
    pcVar6 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/core/conflict.cpp"
                     ,0x2f);
    if (pcVar6 == (char *)0x0) {
      pcVar6 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/core/conflict.cpp"
      ;
    }
    else {
      pcVar6 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/core/conflict.cpp"
                       ,0x2f);
      pcVar6 = pcVar6 + 1;
    }
    fprintf(__stream,"%s:%d: ",pcVar6,0x18d);
    fprintf(_stderr,"Not yet supported\n");
    abort();
  }
  uVar2 = uVar1;
  iVar3 = decisionLevel((SAT *)0x29a685);
  if (((int)uVar2 < iVar3) && ((*(uint *)in_RDI[0x1e] >> 1 & 1) != 0)) {
    CVar7 = (Clause)Clause_new<Clause>(in_RDI,(bool)learnt);
    in_RDI[0x1e] = CVar7;
    *(uint *)in_RDI[0x1e] = *(uint *)in_RDI[0x1e] & 0xfffffffd | 2;
    vec<vec<Clause_*>_>::operator[]((vec<vec<Clause_*>_> *)(in_RDI + 0x1c),uVar1);
    vec<Clause_*>::push((vec<Clause_*> *)in_stack_ffffffffffffffc0,
                        (Clause **)in_stack_ffffffffffffffb8);
  }
  btToLevel(in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
  return uVar1;
}

Assistant:

int SAT::findConflictLevel() {
	int tp = -1;
	for (unsigned int i = 0; i < confl->size(); i++) {
		const int l = trailpos[var((*confl)[i])];
		if (l > tp) {
			tp = l;
		}
	}
	const int clevel = engine.tpToLevel(tp);

	if (so.sym_static && clevel == 0) {
		btToLevel(0);
		engine.async_fail = true;
		NOT_SUPPORTED;
		// need to abort analyze as well
		return 0;
	}
	assert(clevel > 0);

	// duplicate conflict clause in case it gets freed
	if (clevel < decisionLevel() && confl->temp_expl) {
		confl = Clause_new(*confl);
		confl->temp_expl = 1;
		rtrail[clevel].push(confl);
	}
	btToLevel(clevel);

	//	fprintf(stderr, "clevel = %d\n", clevel);

	if (PRINT_ANALYSIS) {
		printf("Conflict: level = %d\n", clevel);
	}

	return clevel;
}